

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBvhTriangleMeshShape.cpp
# Opt level: O3

void __thiscall
cbtBvhTriangleMeshShape::performConvexcast::MyNodeOverlapCallback::processNode
          (MyNodeOverlapCallback *this,int nodeSubPart,int nodeTriangleIndex)

{
  float fVar1;
  undefined8 uVar2;
  cbtStridingMeshInterface *pcVar3;
  undefined1 auVar4 [16];
  long lVar5;
  uint uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  float fVar9;
  PHY_ScalarType indicestype;
  int stride;
  uchar *vertexbase;
  int numfaces;
  int indexstride;
  PHY_ScalarType type;
  int numverts;
  uchar *indexbase;
  cbtVector3 m_triangle [3];
  
  (*this->m_meshInterface->_vptr_cbtStridingMeshInterface[4])
            (this->m_meshInterface,&vertexbase,&numverts,&type,&stride,&indexbase,&indexstride,
             &numfaces,&indicestype,nodeSubPart);
  pcVar3 = this->m_meshInterface;
  lVar5 = 0;
  do {
    if (indicestype == PHY_SHORT) {
      uVar6 = (uint)*(ushort *)(indexbase + lVar5 + (long)(indexstride * nodeTriangleIndex) + 4);
    }
    else {
      uVar6 = *(uint *)(indexbase + lVar5 * 2 + (long)(indexstride * nodeTriangleIndex) + 8);
    }
    lVar7 = (long)(int)uVar6 * (long)stride;
    if (type == PHY_FLOAT) {
      uVar2 = *(undefined8 *)(pcVar3->m_scaling).m_floats;
      auVar8._0_4_ = (float)*(undefined8 *)(vertexbase + lVar7) * (float)uVar2;
      auVar8._4_4_ = (float)((ulong)*(undefined8 *)(vertexbase + lVar7) >> 0x20) *
                     (float)((ulong)uVar2 >> 0x20);
      auVar8._8_8_ = 0;
      fVar9 = *(float *)(vertexbase + lVar7 + 8);
    }
    else {
      auVar4 = vcvtpd2ps_avx(*(undefined1 (*) [16])(vertexbase + lVar7));
      uVar2 = *(undefined8 *)(pcVar3->m_scaling).m_floats;
      auVar8._0_4_ = (float)uVar2 * auVar4._0_4_;
      auVar8._4_4_ = (float)((ulong)uVar2 >> 0x20) * auVar4._4_4_;
      auVar8._8_4_ = auVar4._8_4_ * 0.0;
      auVar8._12_4_ = auVar4._12_4_ * 0.0;
      fVar9 = (float)*(double *)(vertexbase + lVar7 + 0x10);
    }
    fVar1 = (pcVar3->m_scaling).m_floats[2];
    uVar2 = vmovlps_avx(auVar8);
    *(undefined8 *)(m_triangle[2].m_floats + lVar5 * 2) = uVar2;
    m_triangle[2].m_floats[lVar5 * 2 + 2] = fVar9 * fVar1;
    m_triangle[2].m_floats[lVar5 * 2 + 3] = 0.0;
    lVar5 = lVar5 + -2;
  } while (lVar5 != -6);
  (*this->m_callback->_vptr_cbtTriangleCallback[2])
            (this->m_callback,m_triangle,nodeSubPart,(ulong)(uint)nodeTriangleIndex);
  (*this->m_meshInterface->_vptr_cbtStridingMeshInterface[6])(this->m_meshInterface,nodeSubPart);
  return;
}

Assistant:

virtual void processNode(int nodeSubPart, int nodeTriangleIndex)
		{
			cbtVector3 m_triangle[3];
			const unsigned char* vertexbase;
			int numverts;
			PHY_ScalarType type;
			int stride;
			const unsigned char* indexbase;
			int indexstride;
			int numfaces;
			PHY_ScalarType indicestype;

			m_meshInterface->getLockedReadOnlyVertexIndexBase(
				&vertexbase,
				numverts,
				type,
				stride,
				&indexbase,
				indexstride,
				numfaces,
				indicestype,
				nodeSubPart);

			unsigned int* gfxbase = (unsigned int*)(indexbase + nodeTriangleIndex * indexstride);
			cbtAssert(indicestype == PHY_INTEGER || indicestype == PHY_SHORT);

			const cbtVector3& meshScaling = m_meshInterface->getScaling();
			for (int j = 2; j >= 0; j--)
			{
				int graphicsindex = indicestype == PHY_SHORT ? ((unsigned short*)gfxbase)[j] : gfxbase[j];

				if (type == PHY_FLOAT)
				{
					float* graphicsbase = (float*)(vertexbase + graphicsindex * stride);

					m_triangle[j] = cbtVector3(graphicsbase[0] * meshScaling.getX(), graphicsbase[1] * meshScaling.getY(), graphicsbase[2] * meshScaling.getZ());
				}
				else
				{
					double* graphicsbase = (double*)(vertexbase + graphicsindex * stride);

					m_triangle[j] = cbtVector3(cbtScalar(graphicsbase[0]) * meshScaling.getX(), cbtScalar(graphicsbase[1]) * meshScaling.getY(), cbtScalar(graphicsbase[2]) * meshScaling.getZ());
				}
			}

			/* Perform ray vs. triangle collision here */
			m_callback->processTriangle(m_triangle, nodeSubPart, nodeTriangleIndex);
			m_meshInterface->unLockReadOnlyVertexBase(nodeSubPart);
		}